

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v9::detail::digit_grouping<char>::digit_grouping
          (digit_grouping<char> *this,locale_ref loc,bool localized)

{
  undefined3 in_register_00000011;
  thousands_sep_result<char> tStack_38;
  
  (this->sep_).grouping._M_dataplus._M_p = (pointer)&(this->sep_).grouping.field_2;
  (this->sep_).grouping._M_string_length = 0;
  (this->sep_).grouping.field_2._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000011,localized) == 0) {
    (this->sep_).thousands_sep = '\0';
  }
  else {
    thousands_sep<char>(&tStack_38,loc);
    thousands_sep_result<char>::operator=(&this->sep_,&tStack_38);
    std::__cxx11::string::~string((string *)&tStack_38);
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }